

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBuilderTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutBuilderTests::TrimmingSingleRangeRestoresExtentAndGlyphs
          (LayoutBuilderTests *this)

{
  float fVar1;
  state *psVar2;
  allocator local_851;
  string local_850;
  LocationInfo local_830;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_808;
  ref_text_line local_7f0;
  uint local_7c8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7a8;
  shared_ptr<agge::font> local_790;
  ref_glyph_run local_780;
  uint local_744;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_740;
  shared_ptr<agge::font> local_728;
  ref_glyph_run local_718;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_6e0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_6c8;
  ref_text_line local_6b0;
  uint local_688 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_680;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_668;
  shared_ptr<agge::font> local_650;
  ref_glyph_run local_640;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_608;
  ref_text_line local_5f0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_5c8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_5b0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_598;
  allocator local_579;
  string local_578;
  LocationInfo local_558;
  state local_530;
  state s2;
  string local_520;
  LocationInfo local_500;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_4d8;
  ref_text_line local_4c0;
  uint local_498 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_490;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  shared_ptr<agge::font> local_460;
  ref_glyph_run local_450;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_418;
  ref_text_line local_400;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_3d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_3c0;
  allocator local_3a1;
  string local_3a0;
  LocationInfo local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  shared_ptr<agge::font> local_340;
  ref_glyph_run local_330;
  uint local_2f8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  shared_ptr<agge::font> local_2c0;
  ref_glyph_run local_2b0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_278;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_260;
  allocator local_241;
  string local_240;
  LocationInfo local_220;
  allocator local_1f1;
  string local_1f0;
  LocationInfo local_1d0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1a8;
  ref_text_line local_188;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_160;
  allocator local_141;
  string local_140;
  LocationInfo local_120;
  uint local_f8 [5];
  uint local_e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  shared_ptr<agge::font> local_b0;
  ref_glyph_run local_a0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_68;
  state local_50;
  state s1;
  layout_builder m;
  LayoutBuilderTests *this_local;
  
  layout_builder::layout_builder
            ((layout_builder *)&s1,&this->glyphs,&this->glyph_runs,&this->text_lines);
  layout_builder::begin_style((layout_builder *)&s1,&this->font2);
  layout_builder::append_glyph((layout_builder *)&s1,0xb,3.0);
  layout_builder::append_glyph((layout_builder *)&s1,0xc,5.3);
  psVar2 = layout_builder::get_state((layout_builder *)&s1);
  local_50 = *psVar2;
  layout_builder::append_glyph((layout_builder *)&s1,0xd,3.1);
  layout_builder::trim_current_line((layout_builder *)&s1,&local_50);
  std::shared_ptr<agge::font>::shared_ptr(&local_b0,&this->font2);
  local_e4 = 0xb;
  plural_::operator+(&local_e0,(plural_ *)&plural,&local_e4);
  local_f8[0] = 0xc;
  tests::operator+(&local_c8,&local_e0,local_f8);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_a0,&local_b0,0.0,0.0,&local_c8);
  plural_::operator+(&local_68,(plural_ *)&plural,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_141);
  ut::LocationInfo::LocationInfo(&local_120,&local_140,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            (&local_68,&this->glyph_runs,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_68);
  ref_glyph_run::~ref_glyph_run(&local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  std::shared_ptr<agge::font>::~shared_ptr(&local_b0);
  local_1a8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_1a8);
  ref_text_line::ref_text_line(&local_188,0.0,0.0,0.0,&local_1a8);
  plural_::operator+(&local_160,(plural_ *)&plural,&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_1f1);
  ut::LocationInfo::LocationInfo(&local_1d0,&local_1f0,0x130);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_160,&this->text_lines,&local_1d0);
  ut::LocationInfo::~LocationInfo(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_160);
  ref_text_line::~ref_text_line(&local_188);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1a8);
  psVar2 = layout_builder::get_state((layout_builder *)&s1);
  fVar1 = psVar2->extent;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_241);
  ut::LocationInfo::LocationInfo(&local_220,&local_240,0x131);
  ut::are_approx_equal<float>(8.3,fVar1,0.001,&local_220);
  ut::LocationInfo::~LocationInfo(&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  layout_builder::break_current_line((layout_builder *)&s1);
  std::shared_ptr<agge::font>::shared_ptr(&local_2c0,&this->font2);
  local_2f8[1] = 0xb;
  plural_::operator+(&local_2f0,(plural_ *)&plural,local_2f8 + 1);
  local_2f8[0] = 0xc;
  tests::operator+(&local_2d8,&local_2f0,local_2f8);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_2b0,&local_2c0,0.0,0.0,&local_2d8);
  plural_::operator+(&local_278,(plural_ *)&plural,&local_2b0);
  std::shared_ptr<agge::font>::shared_ptr(&local_340,&this->font2);
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_358);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_330,&local_340,0.0,0.0,&local_358);
  tests::operator+(&local_260,&local_278,&local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_3a1);
  ut::LocationInfo::LocationInfo(&local_380,&local_3a0,0x13a);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            (&local_260,&this->glyph_runs,&local_380);
  ut::LocationInfo::~LocationInfo(&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_260);
  ref_glyph_run::~ref_glyph_run(&local_330);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_358);
  std::shared_ptr<agge::font>::~shared_ptr(&local_340);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_278);
  ref_glyph_run::~ref_glyph_run(&local_2b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2f0);
  std::shared_ptr<agge::font>::~shared_ptr(&local_2c0);
  std::shared_ptr<agge::font>::shared_ptr(&local_460,&this->font2);
  local_498[1] = 0xb;
  plural_::operator+(&local_490,(plural_ *)&plural,local_498 + 1);
  local_498[0] = 0xc;
  tests::operator+(&local_478,&local_490,local_498);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_450,&local_460,0.0,0.0,&local_478);
  plural_::operator+(&local_418,(plural_ *)&plural,&local_450);
  ref_text_line::ref_text_line(&local_400,0.0,11.0,8.3,&local_418);
  plural_::operator+(&local_3d8,(plural_ *)&plural,&local_400);
  local_4d8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_4d8);
  ref_text_line::ref_text_line(&local_4c0,0.0,19.3,0.0,&local_4d8);
  tests::operator+(&local_3c0,&local_3d8,&local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,(allocator *)((long)&s2.next + 3));
  ut::LocationInfo::LocationInfo(&local_500,&local_520,0x13f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_3c0,&this->text_lines,&local_500);
  ut::LocationInfo::~LocationInfo(&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s2.next + 3));
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_3c0);
  ref_text_line::~ref_text_line(&local_4c0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_3d8);
  ref_text_line::~ref_text_line(&local_400);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_418);
  ref_glyph_run::~ref_glyph_run(&local_450);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_490);
  std::shared_ptr<agge::font>::~shared_ptr(&local_460);
  layout_builder::append_glyph((layout_builder *)&s1,0xe,5.7);
  layout_builder::begin_style((layout_builder *)&s1,&this->font1);
  layout_builder::append_glyph((layout_builder *)&s1,0xf,3.2);
  layout_builder::append_glyph((layout_builder *)&s1,0x10,2.9);
  psVar2 = layout_builder::get_state((layout_builder *)&s1);
  local_530 = *psVar2;
  layout_builder::append_glyph((layout_builder *)&s1,0x11,3.6);
  layout_builder::trim_current_line((layout_builder *)&s1,&local_530);
  psVar2 = layout_builder::get_state((layout_builder *)&s1);
  fVar1 = psVar2->extent;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_578,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_579);
  ut::LocationInfo::LocationInfo(&local_558,&local_578,0x14d);
  ut::are_approx_equal<float>(11.8,fVar1,0.001,&local_558);
  ut::LocationInfo::~LocationInfo(&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  layout_builder::break_current_line((layout_builder *)&s1);
  std::shared_ptr<agge::font>::shared_ptr(&local_650,&this->font2);
  local_688[1] = 0xb;
  plural_::operator+(&local_680,(plural_ *)&plural,local_688 + 1);
  local_688[0] = 0xc;
  tests::operator+(&local_668,&local_680,local_688);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_640,&local_650,0.0,0.0,&local_668);
  plural_::operator+(&local_608,(plural_ *)&plural,&local_640);
  ref_text_line::ref_text_line(&local_5f0,0.0,11.0,8.3,&local_608);
  plural_::operator+(&local_5c8,(plural_ *)&plural,&local_5f0);
  std::shared_ptr<agge::font>::shared_ptr(&local_728,&this->font2);
  local_744 = 0xe;
  plural_::operator+(&local_740,(plural_ *)&plural,&local_744);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_718,&local_728,0.0,0.0,&local_740);
  plural_::operator+(&local_6e0,(plural_ *)&plural,&local_718);
  std::shared_ptr<agge::font>::shared_ptr(&local_790,&this->font1);
  local_7c8[1] = 0xf;
  plural_::operator+(&local_7c0,(plural_ *)&plural,local_7c8 + 1);
  local_7c8[0] = 0x10;
  tests::operator+(&local_7a8,&local_7c0,local_7c8);
  ref_glyph_run::ref_glyph_run<unsigned_int>(&local_780,&local_790,5.7,0.0,&local_7a8);
  tests::operator+(&local_6c8,&local_6e0,&local_780);
  ref_text_line::ref_text_line(&local_6b0,0.0,30.3,11.8,&local_6c8);
  tests::operator+(&local_5b0,&local_5c8,&local_6b0);
  local_808.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_808.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_808.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_808);
  ref_text_line::ref_text_line(&local_7f0,0.0,38.6,0.0,&local_808);
  tests::operator+(&local_598,&local_5b0,&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_850,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,&local_851);
  ut::LocationInfo::LocationInfo(&local_830,&local_850,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_598,&this->text_lines,&local_830);
  ut::LocationInfo::~LocationInfo(&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_598);
  ref_text_line::~ref_text_line(&local_7f0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_808);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_5b0);
  ref_text_line::~ref_text_line(&local_6b0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_6c8);
  ref_glyph_run::~ref_glyph_run(&local_780);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7c0);
  std::shared_ptr<agge::font>::~shared_ptr(&local_790);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_6e0);
  ref_glyph_run::~ref_glyph_run(&local_718);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_740);
  std::shared_ptr<agge::font>::~shared_ptr(&local_728);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_5c8);
  ref_text_line::~ref_text_line(&local_5f0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_608);
  ref_glyph_run::~ref_glyph_run(&local_640);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_668);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_680);
  std::shared_ptr<agge::font>::~shared_ptr(&local_650);
  return;
}

Assistant:

test( TrimmingSingleRangeRestoresExtentAndGlyphs )
			{
				// INIT
				layout_builder m(glyphs, glyph_runs, text_lines);

				m.begin_style(font2);
				m.append_glyph(11, 3.0f);
				m.append_glyph(12, 5.3f);
				layout_builder::state s1 = m.get_state();
				m.append_glyph(13, 3.1f);

				// ACT
				m.trim_current_line(s1);

				// ASSERT
				assert_equal(plural + ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u), glyph_runs);
				assert_equal(plural + ref_text_line(0.0f, 0.0f, 0.0f, vector<ref_glyph_run>()), text_lines);
				assert_approx_equal(8.3f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u)
					+ ref_glyph_run(font2, 0.0f, 0.0f, vector<glyph_index_t>()),
					glyph_runs);
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 19.3f, 0.0f, vector<ref_glyph_run>()),
					text_lines);

				// INIT
				m.append_glyph(14, 5.7f);
				m.begin_style(font1);
				m.append_glyph(15, 3.2f);
				m.append_glyph(16, 2.9f);
				layout_builder::state s2 = m.get_state();
				m.append_glyph(17, 3.6f);

				// ACT
				m.trim_current_line(s2);

				//ASSERT
				assert_approx_equal(11.8f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 30.3f, 11.8f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 14u)
						+ ref_glyph_run(font1, 5.7f, 0.0f, plural + 15u + 16u))
					+ ref_text_line(0.0f, 38.6f, 0.0f, vector<ref_glyph_run>()),
					text_lines);
			}